

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmTarget *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  ostream *poVar5;
  string *psVar6;
  bool local_129;
  byte local_ed;
  allocator<char> local_e1;
  string local_e0;
  byte local_bb;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  cmValue local_70;
  cmValue xcodeVersion;
  allocator<char> local_51;
  string local_50;
  cmMakefile *local_30;
  cmMakefile *mf;
  string *toDestDirPath_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  mf = (cmMakefile *)toDestDirPath;
  toDestDirPath_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  local_30 = cmTarget::GetMakefile(this->Target->Target);
  bVar2 = cmMakefile::PlatformIsAppleEmbedded(local_30);
  pcVar1 = local_30;
  xcodeVersion.Value._3_1_ = 0;
  local_ed = 1;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"XCODE",&local_51);
    xcodeVersion.Value._3_1_ = 1;
    bVar3 = cmMakefile::IsOn(pcVar1,&local_50);
    local_ed = bVar3 ^ 0xff;
  }
  if ((xcodeVersion.Value._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_51);
  }
  pcVar1 = local_30;
  if ((local_ed & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"XCODE_VERSION",&local_91);
    local_70 = cmMakefile::GetDefinition(pcVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    bVar2 = cmValue::operator_cast_to_bool(&local_70);
    local_ba = 0;
    local_bb = 0;
    local_129 = true;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_ba = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"6",&local_b9);
      local_bb = 1;
      psVar6 = cmValue::operator*[abi_cxx11_(&local_70);
      local_129 = cmSystemTools::VersionCompareGreater(&local_b8,psVar6);
    }
    if ((local_bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((local_ba & 1) != 0) {
      std::allocator<char>::~allocator(&local_b9);
    }
    if ((local_129 == false) &&
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 < OBJECT_LIBRARY)) {
      this_00 = this->Target->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"IOS_INSTALL_COMBINED",&local_e1);
      bVar2 = cmTarget::GetPropertyAsBool(this_00,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        poVar5 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        std::operator<<(poVar5,"include(CMakeIOSInstallCombined)\n");
        poVar5 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        poVar5 = std::operator<<(poVar5,"ios_install_combined(");
        poVar5 = std::operator<<(poVar5,"\"");
        psVar6 = cmTarget::GetName_abi_cxx11_(this->Target->Target);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\" ");
        poVar5 = std::operator<<(poVar5,"\"");
        poVar5 = std::operator<<(poVar5,(string *)mf);
        std::operator<<(poVar5,"\")\n");
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleEmbedded() || !mf->IsOn("XCODE")) {
    return;
  }

  cmValue xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", *xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}